

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_filter.cpp
# Opt level: O1

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::ConstantFilter::Copy(ConstantFilter *this)

{
  ExpressionType comparison_type_p;
  ConstantFilter *this_00;
  long in_RSI;
  Value VStack_68;
  
  this_00 = (ConstantFilter *)operator_new(0x50);
  comparison_type_p = *(ExpressionType *)(in_RSI + 9);
  Value::Value(&VStack_68,(Value *)(in_RSI + 0x10));
  ConstantFilter(this_00,comparison_type_p,&VStack_68);
  Value::~Value(&VStack_68);
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_00;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> ConstantFilter::Copy() const {
	return make_uniq<ConstantFilter>(comparison_type, constant);
}